

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall prometheus::anon_unknown_0::IntegrationTest::IntegrationTest(IntegrationTest *this)

{
  allocator local_11;
  IntegrationTest *local_10;
  IntegrationTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__IntegrationTest_00241970;
  std::function<void_(void_*)>::function(&this->fetchPrePerform_);
  std::unique_ptr<prometheus::Exposer,std::default_delete<prometheus::Exposer>>::
  unique_ptr<std::default_delete<prometheus::Exposer>,void>
            ((unique_ptr<prometheus::Exposer,std::default_delete<prometheus::Exposer>> *)
             &this->exposer_);
  std::__cxx11::string::string((string *)&this->base_url_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->default_metrics_path_,"/metrics",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return;
}

Assistant:

void SetUp() override {
    exposer_ = detail::make_unique<Exposer>("127.0.0.1:0");
    auto ports = exposer_->GetListeningPorts();
    base_url_ = std::string("http://127.0.0.1:") + std::to_string(ports.at(0));
  }